

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint display_density,
          uint mesh_density_reduction)

{
  uchar *sides;
  ON_SubDMeshFragmentGrid *pOVar1;
  uint *puVar2;
  uint *puVar3;
  uchar *puVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  ON__UINT16 OVar12;
  ON__UINT32 OVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  undefined2 uVar16;
  ON_SubDMeshFragmentGrid *pOVar17;
  undefined2 uVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ON_SubDMeshFragmentGrid *pOVar23;
  ON_SubDMeshFragmentGrid *pOVar24;
  ON_SubDMeshFragmentGrid *pOVar25;
  ON_SubDMeshFragmentGrid *pOVar26;
  uint uVar27;
  uint i;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  uint side_segment_count;
  uint s2;
  uint uVar32;
  ON_SubDMeshFragmentGrid *quads;
  ON_SubDMeshFragmentGrid *pOVar33;
  int iVar34;
  ON_MemoryAllocationTracking disable_tracking;
  
  if (display_density < 9) {
    pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
    if (QuadGridFromDisplayDensity::grid_cache[display_density] == (ON_SubDMeshFragmentGrid *)0x0) {
      bVar19 = ON_SleepLock::GetLock(&QuadGridFromDisplayDensity::lock,0x32,60000,true);
      pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
      if (pOVar1 != (ON_SubDMeshFragmentGrid *)0x0) {
        ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
        do {
          pOVar23 = pOVar1;
          if (mesh_density_reduction <= pOVar23->m_F_level_of_detail) break;
          pOVar1 = pOVar23->m_next_level_of_detail;
        } while (pOVar23->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
        uVar5 = pOVar23->m_reserved1;
        uVar6 = pOVar23->m_reserved2;
        uVar7 = pOVar23->m_side_segment_count;
        uVar8 = pOVar23->m_reserved3;
        uVar9 = pOVar23->m_F_count;
        uVar10 = pOVar23->m_F_level_of_detail;
        uVar11 = pOVar23->m_F_stride;
        OVar12 = pOVar23->m_reserved4;
        OVar13 = pOVar23->m_reserved5;
        puVar2 = pOVar23->m_F;
        puVar3 = pOVar23->m_S;
        pOVar1 = pOVar23->m_next_level_of_detail;
        __return_storage_ptr__->m_prev_level_of_detail = pOVar23->m_prev_level_of_detail;
        __return_storage_ptr__->m_next_level_of_detail = pOVar1;
        __return_storage_ptr__->m_F = puVar2;
        __return_storage_ptr__->m_S = puVar3;
        __return_storage_ptr__->m_reserved1 = uVar5;
        __return_storage_ptr__->m_reserved2 = uVar6;
        __return_storage_ptr__->m_side_segment_count = uVar7;
        __return_storage_ptr__->m_reserved3 = uVar8;
        __return_storage_ptr__->m_F_count = uVar9;
        __return_storage_ptr__->m_F_level_of_detail = uVar10;
        __return_storage_ptr__->m_F_stride = uVar11;
        __return_storage_ptr__->m_reserved4 = OVar12;
        __return_storage_ptr__->m_reserved5 = OVar13;
        return __return_storage_ptr__;
      }
      uVar29 = 0;
      ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
      uVar20 = 4;
      if (4 < display_density) {
        uVar20 = display_density;
      }
      uVar30 = (ulong)display_density;
      if (4 >= display_density) {
        uVar30 = uVar29;
      }
      uVar27 = (uint)uVar30;
      iVar34 = 0;
      iVar31 = 0;
      for (; (uint)uVar30 <= uVar20; uVar30 = (ulong)((uint)uVar30 + 1)) {
        for (uVar32 = 1 << ((byte)uVar30 & 0x1f); uVar32 != 0; uVar32 = uVar32 >> 1) {
          uVar21 = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(uVar32);
          iVar31 = iVar31 + uVar21;
          iVar34 = iVar34 + uVar32 * 4 + 1;
          uVar29 = (ulong)((int)uVar29 + 1);
        }
      }
      uVar28 = (ulong)(uint)(iVar34 + iVar31 * 4);
      uVar30 = uVar28 * 4;
      if (uVar30 % 0x30 != 0) {
        uVar30 = (uVar28 / 0xc) * 0x30 + 0x30;
      }
      uVar30 = uVar30 + uVar29 * 0x30;
      pOVar24 = (ON_SubDMeshFragmentGrid *)
                operator_new__(uVar30 - uVar30 % 0x30,(nothrow_t *)&std::nothrow);
      pOVar23 = Empty.m_next_level_of_detail;
      pOVar1 = Empty.m_prev_level_of_detail;
      uVar16 = Empty.m_reserved5._2_2_;
      uVar15 = Empty._10_4_;
      uVar5 = Empty.m_reserved3;
      uVar14 = Empty._0_2_;
      pOVar33 = pOVar24 + uVar29;
      puVar4 = &pOVar33->m_reserved1;
      for (; uVar27 <= uVar20; uVar27 = uVar27 + 1) {
        uVar32 = 1 << ((byte)uVar27 & 0x1f);
        uVar21 = 0;
        pOVar17 = pOVar24;
        pOVar26 = (ON_SubDMeshFragmentGrid *)0x0;
        quads = pOVar33;
        for (uVar29 = (ulong)uVar32; pOVar25 = pOVar17, side_segment_count = (uint)uVar29,
            pOVar33 = quads, side_segment_count != 0; uVar29 = uVar29 >> 1) {
          uVar22 = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(side_segment_count);
          uVar30 = (ulong)(side_segment_count * 4 + 1);
          sides = &quads->m_reserved1 + (ulong)(uVar22 * 4) * 4;
          pOVar33 = (ON_SubDMeshFragmentGrid *)(sides + uVar30 * 4);
          if ((ON_SubDMeshFragmentGrid *)(puVar4 + uVar28 * 4) < pOVar33) {
            ON_SubDIncrementErrorCount();
            break;
          }
          SetQuads(uVar32,uVar21,(uint *)quads,(ulong)uVar22,4,(uint *)sides,uVar30,1);
          uVar18 = Empty._0_2_;
          Empty.m_reserved1 = (uchar)uVar14;
          Empty.m_reserved2 = SUB21(uVar14,1);
          uVar6 = Empty.m_reserved2;
          pOVar25->m_reserved1 = Empty.m_reserved1;
          Empty._0_2_ = uVar18;
          pOVar25->m_reserved2 = uVar6;
          pOVar25->m_side_segment_count = (uchar)uVar29;
          pOVar25->m_reserved3 = uVar5;
          pOVar25->m_F_count = (unsigned_short)uVar22;
          pOVar25->m_F_level_of_detail = (unsigned_short)uVar21;
          pOVar25->m_F_stride = 4;
          *(undefined4 *)&pOVar25->m_reserved4 = uVar15;
          *(undefined2 *)((long)&pOVar25->m_reserved5 + 2) = uVar16;
          pOVar25->m_F = (uint *)quads;
          pOVar25->m_S = (uint *)sides;
          pOVar25->m_prev_level_of_detail = pOVar1;
          pOVar25->m_next_level_of_detail = pOVar23;
          if (pOVar26 != (ON_SubDMeshFragmentGrid *)0x0) {
            pOVar25->m_prev_level_of_detail = pOVar26;
            pOVar26->m_next_level_of_detail = pOVar25;
          }
          uVar21 = uVar21 + 1;
          pOVar17 = pOVar25 + 1;
          pOVar26 = pOVar25;
          quads = pOVar33;
        }
        QuadGridFromDisplayDensity::grid_cache[uVar27] = pOVar24;
        pOVar24 = pOVar25;
      }
      if (bVar19) {
        ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
      }
      if (pOVar33 != (ON_SubDMeshFragmentGrid *)(puVar4 + uVar28 * 4)) {
        ON_SubDIncrementErrorCount();
      }
      pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
      if (QuadGridFromDisplayDensity::grid_cache[display_density] == (ON_SubDMeshFragmentGrid *)0x0)
      {
        ON_SubDIncrementErrorCount();
        pOVar23 = &Empty;
      }
      else {
        do {
          pOVar23 = pOVar1;
          if (mesh_density_reduction <= pOVar23->m_F_level_of_detail) break;
          pOVar1 = pOVar23->m_next_level_of_detail;
        } while (pOVar23->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
      }
      uVar5 = pOVar23->m_reserved1;
      uVar6 = pOVar23->m_reserved2;
      uVar7 = pOVar23->m_side_segment_count;
      uVar8 = pOVar23->m_reserved3;
      uVar9 = pOVar23->m_F_count;
      uVar10 = pOVar23->m_F_level_of_detail;
      uVar11 = pOVar23->m_F_stride;
      OVar12 = pOVar23->m_reserved4;
      OVar13 = pOVar23->m_reserved5;
      puVar2 = pOVar23->m_F;
      puVar3 = pOVar23->m_S;
      pOVar1 = pOVar23->m_next_level_of_detail;
      __return_storage_ptr__->m_prev_level_of_detail = pOVar23->m_prev_level_of_detail;
      __return_storage_ptr__->m_next_level_of_detail = pOVar1;
      __return_storage_ptr__->m_F = puVar2;
      __return_storage_ptr__->m_S = puVar3;
      __return_storage_ptr__->m_reserved1 = uVar5;
      __return_storage_ptr__->m_reserved2 = uVar6;
      __return_storage_ptr__->m_side_segment_count = uVar7;
      __return_storage_ptr__->m_reserved3 = uVar8;
      __return_storage_ptr__->m_F_count = uVar9;
      __return_storage_ptr__->m_F_level_of_detail = uVar10;
      __return_storage_ptr__->m_F_stride = uVar11;
      __return_storage_ptr__->m_reserved4 = OVar12;
      __return_storage_ptr__->m_reserved5 = OVar13;
      ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
      return __return_storage_ptr__;
    }
    do {
      pOVar23 = pOVar1;
      if (mesh_density_reduction <= pOVar23->m_F_level_of_detail) break;
      pOVar1 = pOVar23->m_next_level_of_detail;
    } while (pOVar23->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
  }
  else {
    ON_SubDIncrementErrorCount();
    pOVar23 = &Empty;
  }
  uVar5 = pOVar23->m_reserved1;
  uVar6 = pOVar23->m_reserved2;
  uVar7 = pOVar23->m_side_segment_count;
  uVar8 = pOVar23->m_reserved3;
  uVar9 = pOVar23->m_F_count;
  uVar10 = pOVar23->m_F_level_of_detail;
  uVar11 = pOVar23->m_F_stride;
  OVar12 = pOVar23->m_reserved4;
  OVar13 = pOVar23->m_reserved5;
  puVar2 = pOVar23->m_F;
  puVar3 = pOVar23->m_S;
  pOVar1 = pOVar23->m_next_level_of_detail;
  __return_storage_ptr__->m_prev_level_of_detail = pOVar23->m_prev_level_of_detail;
  __return_storage_ptr__->m_next_level_of_detail = pOVar1;
  __return_storage_ptr__->m_F = puVar2;
  __return_storage_ptr__->m_S = puVar3;
  __return_storage_ptr__->m_reserved1 = uVar5;
  __return_storage_ptr__->m_reserved2 = uVar6;
  __return_storage_ptr__->m_side_segment_count = uVar7;
  __return_storage_ptr__->m_reserved3 = uVar8;
  __return_storage_ptr__->m_F_count = uVar9;
  __return_storage_ptr__->m_F_level_of_detail = uVar10;
  __return_storage_ptr__->m_F_stride = uVar11;
  __return_storage_ptr__->m_reserved4 = OVar12;
  __return_storage_ptr__->m_reserved5 = OVar13;
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(
  unsigned int display_density,
  unsigned int mesh_density_reduction
  )
{
  static const ON_SubDMeshFragmentGrid* grid_cache[9] = { 0 }; // side_segment_count = 1,2,4,8,16,32,64,128,256

  if ( ((size_t)display_density) >= sizeof(grid_cache)/sizeof(grid_cache[0]))
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);

  const ON_SubDMeshFragmentGrid* fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The code below is thread safe and constructs the ON_SubDLimitMeshFragmentGrids
  // that are resources shared by all ON_SubDLimitMeshFragments.

  static ON_SleepLock lock;
  const bool bReturnLock = lock.GetLock(50,ON_SleepLock::OneMinute,true);

  // try again in case cache was made while waiting
  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    lock.ReturnLock();
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The ON_SubDMeshFragmentGrid classes created below are created one time as needed
  // and used millions of times after that. These are app workspace allocations
  // and not memory leaks. Once a grid exists, it is saved in grid_cache[] and returned
  // above the next zillion times it is required.
  ON_MemoryAllocationTracking disable_tracking(false);

  // make the requested grid
  unsigned int quad_capacity = 0;
  unsigned int side_segment_capacity = 0;
  unsigned int grid_count = 0;
  unsigned int grid_cache_index0 = display_density;
  unsigned int grid_cache_index1 = display_density;
  if (display_density <= ON_SubDDisplayParameters::DefaultDensity)
  {
    // make all the common small grids
    grid_cache_index0 = 0;
    grid_cache_index1 = ON_SubDDisplayParameters::DefaultDensity;
  }
  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    // allocate all levels of detail for each segment side count
    unsigned int s1 = (1U << i);
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2)
    {
      quad_capacity += ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      side_segment_capacity += 4*s2 + 1;
      grid_count++;
    }
  }


  const unsigned int vdex_capacity = (quad_capacity*4 + side_segment_capacity);
  size_t sz1 = grid_count*sizeof(ON_SubDMeshFragmentGrid);
  size_t sz2 = vdex_capacity*sizeof(unsigned int);
  if (0 != sz2 % sizeof(ON_SubDMeshFragmentGrid))
    sz2 = (1 + sz2/sizeof(ON_SubDMeshFragmentGrid))*sizeof(ON_SubDMeshFragmentGrid);
  ON_SubDMeshFragmentGrid* grids = new (std::nothrow) ON_SubDMeshFragmentGrid[(sz1 + sz2)/sizeof(ON_SubDMeshFragmentGrid)];

  ON_SubDMeshFragmentGrid grid = ON_SubDMeshFragmentGrid::Empty;
  grid.m_F_stride = 4;
  unsigned int* vdex0 = (unsigned int*)(grids + grid_count);
  unsigned int* vdex1 = vdex0 + vdex_capacity;
  unsigned int* vdex = vdex0;

  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    const unsigned int s1 = (1U << i);
    ON_SubDMeshFragmentGrid* first_lod = grids;
    ON_SubDMeshFragmentGrid* prev_lod = nullptr;
    grid.m_F_level_of_detail = 0;
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2, grids++)
    {
      const unsigned int grid_F_capacity = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      const unsigned int grid_S_capacity = 4*s2 + 1;

      grid.m_side_segment_count = (unsigned char)s2;
      grid.m_F_count = (unsigned short)grid_F_capacity;
      grid.m_F = vdex;
      vdex += 4*grid_F_capacity;
      grid.m_S = vdex;
      vdex += grid_S_capacity;

      if (vdex > vdex1)
      {
        ON_SubDIncrementErrorCount();
        break;
      }

      ON_SubDMeshFragmentGrid::SetQuads(
        s1, // top level side_segment_count
        grid.m_F_level_of_detail,
        const_cast<unsigned int*>(grid.m_F),
        grid_F_capacity,
        grid.m_F_stride,
        const_cast<unsigned int*>(grid.m_S),
        grid_S_capacity,
        1U
        );

      *grids = grid;
      if ( nullptr != prev_lod )
      {
        grids->m_prev_level_of_detail = prev_lod;
        prev_lod->m_next_level_of_detail = grids;
      }
      prev_lod = grids;

      grid.m_F += (grid.m_F_count*grid.m_F_stride);
      grid.m_F_level_of_detail++;
    }

    // Do not initialize grid_cache[i] until entire linked list is ready to be used.
    // This way if the lock is stolen for some unforeseen reason, we risk leaking memory
    // but we will not crash.
    grid_cache[i] = first_lod;
  }

  if ( bReturnLock )
    lock.ReturnLock();

  if (vdex != vdex1)
  {
    ON_SubDIncrementErrorCount();
  }

  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
}